

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterInfo.cpp
# Opt level: O2

void __thiscall
helics::FilterInfo::addDestinationEndpoint
          (FilterInfo *this,GlobalHandle dest,string_view destName,string_view destType)

{
  pointer pGVar1;
  pointer pEVar2;
  EptInformation *ti_1;
  pointer pEVar3;
  GlobalHandle dest_local;
  string_view destType_local;
  string_view destName_local;
  
  destType_local._M_str = destType._M_str;
  destType_local._M_len = destType._M_len;
  destName_local._M_str = destName._M_str;
  destName_local._M_len = destName._M_len;
  pEVar3 = (this->destEndpoints).
           super__Vector_base<helics::EptInformation,_std::allocator<helics::EptInformation>_>.
           _M_impl.super__Vector_impl_data._M_start;
LAB_002be275:
  pEVar2 = pEVar3;
  if (pEVar2 == (this->destEndpoints).
                super__Vector_base<helics::EptInformation,_std::allocator<helics::EptInformation>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
    dest_local = dest;
    std::vector<helics::EptInformation,std::allocator<helics::EptInformation>>::
    emplace_back<helics::GlobalHandle&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
              ((vector<helics::EptInformation,std::allocator<helics::EptInformation>> *)
               &this->destEndpoints,&dest_local,&destName_local,&destType_local);
    std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::reserve
              (&this->destTargets,
               ((long)(this->destEndpoints).
                      super__Vector_base<helics::EptInformation,_std::allocator<helics::EptInformation>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->destEndpoints).
                     super__Vector_base<helics::EptInformation,_std::allocator<helics::EptInformation>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x48);
    pGVar1 = (this->destTargets).
             super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>._M_impl
             .super__Vector_impl_data._M_start;
    if ((this->destTargets).
        super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>._M_impl.
        super__Vector_impl_data._M_finish != pGVar1) {
      (this->destTargets).
      super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>._M_impl.
      super__Vector_impl_data._M_finish = pGVar1;
    }
    (this->destEpts)._M_string_length = 0;
    *(this->destEpts)._M_dataplus._M_p = '\0';
    pEVar2 = (this->destEndpoints).
             super__Vector_base<helics::EptInformation,_std::allocator<helics::EptInformation>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pEVar3 = (this->destEndpoints).
                  super__Vector_base<helics::EptInformation,_std::allocator<helics::EptInformation>_>
                  ._M_impl.super__Vector_impl_data._M_start; pEVar3 != pEVar2; pEVar3 = pEVar3 + 1)
    {
      std::vector<helics::GlobalHandle,std::allocator<helics::GlobalHandle>>::
      emplace_back<helics::GlobalHandle_const&>
                ((vector<helics::GlobalHandle,std::allocator<helics::GlobalHandle>> *)
                 &this->destTargets,&pEVar3->id);
    }
  }
  else {
    pEVar3 = pEVar2 + 1;
    if (((pEVar2->id).fed_id.gid != dest.fed_id.gid.gid) ||
       ((pEVar2->id).handle.hid != dest.handle.hid.hid)) goto LAB_002be275;
  }
  return;
}

Assistant:

void FilterInfo::addDestinationEndpoint(GlobalHandle dest,
                                        std::string_view destName,
                                        std::string_view destType)
{
    for (const auto& ti : destEndpoints) {
        if (ti.id == dest) {
            return;
        }
    }
    destEndpoints.emplace_back(dest, destName, destType);
    /** now update the target information*/
    destTargets.reserve(destEndpoints.size());
    destTargets.clear();
    destEpts.clear();
    for (const auto& ti : destEndpoints) {
        destTargets.emplace_back(ti.id);
    }
}